

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testInit(VaryingLocationLimitTest *this)

{
  vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
  *this_00;
  pointer *pptVar1;
  iterator iVar2;
  GLuint i;
  GLuint index;
  VaryingLocationLimitTest *this_01;
  GLuint stage;
  STAGES SVar3;
  Type TVar4;
  testCase local_58;
  testCase local_44;
  
  this_00 = &this->m_test_cases;
  index = 0;
  this_01 = this;
  do {
    TVar4 = TestBase::getType((TestBase *)this_01,index);
    SVar3 = COMPUTE;
    do {
      if (SVar3 != COMPUTE) {
        local_44.m_is_input = true;
        local_44.m_type.m_basic_type = TVar4.m_basic_type;
        local_44.m_type._4_8_ = TVar4._4_8_;
        local_58._0_4_ = local_58._0_4_ & 0xffffff00;
        iVar2._M_current =
             (this->m_test_cases).
             super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_58.m_type.m_basic_type = local_44.m_type.m_basic_type;
        local_58.m_type._4_8_ = local_44.m_type._4_8_;
        local_58.m_stage = SVar3;
        local_44.m_stage = SVar3;
        if (iVar2._M_current ==
            (this->m_test_cases).
            super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          this_01 = (VaryingLocationLimitTest *)this_00;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>>
          ::_M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase_const&>
                    ((vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>>
                      *)this_00,iVar2,&local_44);
        }
        else {
          (iVar2._M_current)->m_stage = SVar3;
          (iVar2._M_current)->m_is_input = true;
          *(undefined3 *)&(iVar2._M_current)->field_0x1 = local_44._1_3_;
          ((iVar2._M_current)->m_type).m_basic_type = local_44.m_type.m_basic_type;
          ((iVar2._M_current)->m_type).m_n_columns = local_44.m_type.m_n_columns;
          ((iVar2._M_current)->m_type).m_n_rows = local_44.m_type.m_n_rows;
          pptVar1 = &(this->m_test_cases).
                     super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        if (SVar3 != FRAGMENT) {
          iVar2._M_current =
               (this->m_test_cases).
               super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (this->m_test_cases).
              super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            this_01 = (VaryingLocationLimitTest *)this_00;
            std::
            vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>>
            ::_M_realloc_insert<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase_const&>
                      ((vector<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>>
                        *)this_00,iVar2,&local_58);
          }
          else {
            (iVar2._M_current)->m_stage = local_58.m_stage;
            (iVar2._M_current)->m_is_input = (bool)local_58.m_is_input;
            *(int3 *)&(iVar2._M_current)->field_0x1 = local_58._1_3_;
            ((iVar2._M_current)->m_type).m_basic_type = local_58.m_type.m_basic_type;
            ((iVar2._M_current)->m_type).m_n_columns = local_58.m_type.m_n_columns;
            ((iVar2._M_current)->m_type).m_n_rows = local_58.m_type.m_n_rows;
            pptVar1 = &(this->m_test_cases).
                       super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pptVar1 = *pptVar1 + 1;
          }
        }
      }
      SVar3 = SVar3 + VERTEX;
    } while (SVar3 != STAGE_MAX);
    index = index + 1;
  } while (index != 0x22);
  return;
}

Assistant:

void VaryingLocationLimitTest::testInit()
{
	const GLuint n_types = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type = getType(i);

		for (GLuint stage = 0; stage < Utils::Shader::STAGE_MAX; ++stage)
		{
			if (Utils::Shader::COMPUTE == stage)
			{
				continue;
			}

			testCase test_case_in  = { true, type, (Utils::Shader::STAGES)stage };
			testCase test_case_out = { false, type, (Utils::Shader::STAGES)stage };

			m_test_cases.push_back(test_case_in);

			if (Utils::Shader::FRAGMENT != stage)
			{
				m_test_cases.push_back(test_case_out);
			}
		}
	}
}